

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int push_signature_algorithms(ptls_buffer_t *sendbuf)

{
  uint8_t *puVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  
  iVar3 = ptls_buffer_reserve(sendbuf,2);
  if (iVar3 == 0) {
    puVar1 = sendbuf->base;
    sVar6 = sendbuf->off;
    (puVar1 + sVar6)[0] = '\0';
    (puVar1 + sVar6)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    sVar6 = sendbuf->off;
    iVar3 = ptls_buffer_reserve(sendbuf,2);
    if (iVar3 == 0) {
      puVar1 = sendbuf->base;
      sVar2 = sendbuf->off;
      (puVar1 + sVar2)[0] = '\b';
      (puVar1 + sVar2)[1] = '\x04';
      sendbuf->off = sendbuf->off + 2;
      iVar3 = 0;
    }
    if (iVar3 == 0) {
      iVar3 = ptls_buffer_reserve(sendbuf,2);
      if (iVar3 == 0) {
        puVar1 = sendbuf->base;
        sVar2 = sendbuf->off;
        (puVar1 + sVar2)[0] = '\x04';
        (puVar1 + sVar2)[1] = '\x03';
        sendbuf->off = sendbuf->off + 2;
        iVar3 = 0;
      }
      if (iVar3 == 0) {
        iVar3 = ptls_buffer_reserve(sendbuf,2);
        if (iVar3 == 0) {
          puVar1 = sendbuf->base;
          sVar2 = sendbuf->off;
          (puVar1 + sVar2)[0] = '\x04';
          (puVar1 + sVar2)[1] = '\x01';
          sendbuf->off = sendbuf->off + 2;
          iVar3 = 0;
        }
        if (iVar3 == 0) {
          iVar3 = ptls_buffer_reserve(sendbuf,2);
          if (iVar3 == 0) {
            puVar1 = sendbuf->base;
            sVar2 = sendbuf->off;
            (puVar1 + sVar2)[0] = '\x02';
            (puVar1 + sVar2)[1] = '\x01';
            sendbuf->off = sendbuf->off + 2;
            iVar3 = 0;
          }
          if (iVar3 == 0) {
            uVar5 = sendbuf->off - sVar6;
            lVar4 = 8;
            do {
              sendbuf->base[sVar6 - 2] = (uint8_t)(uVar5 >> ((byte)lVar4 & 0x3f));
              lVar4 = lVar4 + -8;
              sVar6 = sVar6 + 1;
              iVar3 = 0;
            } while (lVar4 != -8);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int push_signature_algorithms(ptls_buffer_t *sendbuf)
{
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PKCS1_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PKCS1_SHA1);
    });

    ret = 0;
Exit:
    return ret;
}